

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

int64_t __thiscall llvm::DataExtractor::getSLEB128(DataExtractor *this,uint64_t *offset_ptr)

{
  ulong uVar1;
  char *pcVar2;
  int64_t iVar3;
  char *local_28;
  char *error;
  uint bytes_read;
  
  uVar1 = (this->Data).Length;
  if (*offset_ptr <= uVar1) {
    pcVar2 = (this->Data).Data;
    iVar3 = decodeSLEB128((uint8_t *)(pcVar2 + *offset_ptr),(uint *)((long)&error + 4),
                          (uint8_t *)(pcVar2 + uVar1),&local_28);
    if (local_28 == (char *)0x0) {
      *offset_ptr = *offset_ptr + (ulong)error._4_4_;
    }
    else {
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("*offset_ptr <= Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                ,0xc4,"int64_t llvm::DataExtractor::getSLEB128(uint64_t *) const");
}

Assistant:

int64_t DataExtractor::getSLEB128(uint64_t *offset_ptr) const {
  assert(*offset_ptr <= Data.size());

  const char *error;
  unsigned bytes_read;
  int64_t result = decodeSLEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error)
    return 0;
  *offset_ptr += bytes_read;
  return result;
}